

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_color.cpp
# Opt level: O0

void __thiscall Prog::draw_swatch(Prog *this,float x1,float y1,float x2,float y2,float *v)

{
  ALLEGRO_FONT *pAVar1;
  Theme *pTVar2;
  undefined4 *in_RSI;
  Dialog *in_RDI;
  undefined4 in_XMM0_Da;
  undefined8 uVar3;
  float in_XMM1_Da;
  ulong uVar4;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  char html [8];
  char *name;
  undefined1 local_40 [8];
  undefined8 local_38;
  undefined8 local_30;
  ulong local_28;
  undefined4 *local_20;
  float local_10;
  undefined4 local_c;
  
  uVar4 = (ulong)(uint)in_RSI[1];
  local_20 = in_RSI;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  local_30 = al_map_rgb_f(*in_RSI,uVar4,in_RSI[2]);
  local_28 = uVar4;
  al_draw_filled_rectangle(in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,in_XMM3_Da,local_30,uVar4);
  local_38 = al_color_rgb_to_name(*local_20,local_20[1],local_20[2]);
  uVar4 = (ulong)(uint)local_20[1];
  al_color_rgb_to_html(*local_20,uVar4,local_20[2]);
  pTVar2 = Dialog::get_theme(in_RDI);
  pAVar1 = pTVar2->font;
  uVar3 = al_map_rgb(0,0);
  al_draw_text(uVar3,uVar4,local_c,local_10 + -20.0,pAVar1,0,local_38);
  pTVar2 = Dialog::get_theme(in_RDI);
  pAVar1 = pTVar2->font;
  uVar3 = al_map_rgb(0,0);
  al_draw_text(uVar3,uVar4,local_c,local_10 + -40.0,pAVar1,0,local_40);
  return;
}

Assistant:

void Prog::draw_swatch(float x1, float y1, float x2, float y2, float v[3])
{
   al_draw_filled_rectangle(x1, y1, x2, y2, al_map_rgb_f(v[0], v[1], v[2]));

   char const *name = al_color_rgb_to_name(v[0], v[1], v[2]);
   char html[8];
   al_color_rgb_to_html(v[0], v[1], v[2], html);
   al_draw_text(d.get_theme().font, al_map_rgb(0, 0, 0), x1, y1 - 20, 0, name);
   al_draw_text(d.get_theme().font, al_map_rgb(0, 0, 0), x1, y1 - 40, 0, html);
}